

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

void readPic<PicHeaderSwitch>(istream *stream,PicHeader *header)

{
  pointer pPVar1;
  PicChunk *chunk;
  pointer pPVar2;
  PicChunkSwitch PVar3;
  PicHeaderSwitch h;
  PicHeaderSwitch PStack_38;
  
  header->isSwitch = true;
  readRaw<PicHeaderSwitch>(&PStack_38,stream);
  header->filesize = (uint32_t)PStack_38.filesize.value_;
  header->version = (uint32_t)PStack_38.version.value_;
  header->ew = (uint16_t)PStack_38.ew.value_;
  header->eh = (uint16_t)PStack_38.eh.value_;
  header->width = (uint16_t)PStack_38.width.value_;
  header->height = (uint16_t)PStack_38.height.value_;
  std::vector<PicChunk,_std::allocator<PicChunk>_>::resize
            (&header->chunks,(ulong)(uint)PStack_38.chunks.value_);
  std::istream::ignore((long)stream);
  pPVar1 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar2 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    PVar3 = readRaw<PicChunkSwitch>(stream);
    pPVar2->x = (uint16_t)PVar3.x.value_.value_;
    pPVar2->y = (uint16_t)PVar3.y.value_.value_;
    pPVar2->offset = (uint32_t)PVar3.offset.value_.value_;
    pPVar2->size = (uint32_t)PVar3.size.value_.value_;
  }
  return;
}

Assistant:

void readPic(std::istream& stream, PicHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	header.filesize = h.filesize.value();
	header.version = h.getVersion();
	header.eh = h.eh.value();
	header.ew = h.ew.value();
	header.width = h.width.value();
	header.height = h.height.value();
	header.chunks.resize(h.chunks.value());

	stream.ignore(h.bytesToSkip());

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		chunk.x = c.x.value();
		chunk.y = c.y.value();
		chunk.offset = c.offset.value();
		chunk.size = c.getSize();
	}
}